

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::GetRegOpnd(Lowerer *this,Opnd *opnd,Instr *insertInstr,Func *func,IRType type)

{
  bool bVar1;
  RegOpnd *pRVar2;
  
  bVar1 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar1) {
    pRVar2 = IR::Opnd::AsRegOpnd(opnd);
    return pRVar2;
  }
  pRVar2 = IR::RegOpnd::New(type,func);
  InsertMove(&pRVar2->super_Opnd,opnd,insertInstr,true);
  return pRVar2;
}

Assistant:

IR::RegOpnd * Lowerer::GetRegOpnd(IR::Opnd* opnd, IR::Instr* insertInstr, Func* func, IRType type)
{
    if (opnd->IsRegOpnd())
    {
        return opnd->AsRegOpnd();
    }
    IR::RegOpnd *regOpnd = IR::RegOpnd::New(type, func);
    InsertMove(regOpnd, opnd, insertInstr);
    return regOpnd;
}